

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

uv_signal_t * uv__signal_first_handle(int signum)

{
  uv_signal_s *puVar1;
  uv_signal_s *puVar2;
  uv__signal_tree_s uVar3;
  long lVar4;
  int iVar5;
  uv_signal_t lookup;
  
  if (uv__signal_tree.rbh_root != (uv_signal_s *)0x0) {
    puVar1 = (uv_signal_s *)0x0;
    uVar3.rbh_root = uv__signal_tree.rbh_root;
    do {
      iVar5 = (uVar3.rbh_root)->signum;
      lVar4 = 0x50;
      puVar2 = uVar3.rbh_root;
      if (iVar5 <= signum) {
        if (iVar5 < signum) {
          lVar4 = 0x58;
          puVar2 = puVar1;
        }
        else if (((uVar3.rbh_root <= &lookup) && ((uVar3.rbh_root)->loop == (uv_loop_t *)0x0)) &&
                (lVar4 = 0x58, puVar2 = puVar1, &lookup <= uVar3.rbh_root)) goto LAB_0010e846;
      }
      uVar3.rbh_root = *(uv_signal_s **)((long)(uVar3.rbh_root)->handle_queue + lVar4 + -0x20);
      puVar1 = puVar2;
    } while (uVar3.rbh_root != (uv_signal_s *)0x0);
    if (puVar2 != (uv_signal_s *)0x0) {
      iVar5 = puVar2->signum;
      uVar3.rbh_root = puVar2;
LAB_0010e846:
      if (iVar5 == signum) {
        return uVar3.rbh_root;
      }
    }
  }
  return (uv_signal_t *)0x0;
}

Assistant:

static uv_signal_t* uv__signal_first_handle(int signum) {
  /* This function must be called with the signal lock held. */
  uv_signal_t lookup;
  uv_signal_t* handle;

  lookup.signum = signum;
  lookup.loop = NULL;

  handle = RB_NFIND(uv__signal_tree_s, &uv__signal_tree, &lookup);

  if (handle != NULL && handle->signum == signum)
    return handle;

  return NULL;
}